

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filemgr.cc
# Opt level: O2

bool filemgr_fhandle_remove(filemgr *file,void *fhandle)

{
  avl_node *node;
  filemgr_fhandle_idx_node query;
  avl_node local_40;
  
  pthread_spin_lock(&file->fhandle_idx_lock);
  node = avl_search(&file->fhandle_idx,&local_40,_fhandle_idx_cmp);
  if (node != (avl_node *)0x0) {
    avl_remove(&file->fhandle_idx,node);
    free(&node[-1].right);
  }
  pthread_spin_unlock(&file->fhandle_idx_lock);
  return node != (avl_node *)0x0;
}

Assistant:

bool filemgr_fhandle_remove(struct filemgr *file, void *fhandle)
{
    bool ret;
    struct filemgr_fhandle_idx_node *item, query;
    struct avl_node *a;

    spin_lock(&file->fhandle_idx_lock);

    query.fhandle = fhandle;
    a = avl_search(&file->fhandle_idx, &query.avl, _fhandle_idx_cmp);
    if (a) {
        // exist, remove & free the item
        item = _get_entry(a, struct filemgr_fhandle_idx_node, avl);
        avl_remove(&file->fhandle_idx, &item->avl);
        free(item);
        ret = true;
    } else {
        ret = false;
    }

    spin_unlock(&file->fhandle_idx_lock);
    return ret;
}